

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O2

size_t mio::detail::query_file_size(file_handle_type handle,error_code *error)

{
  int iVar1;
  error_code eVar2;
  stat sbuf;
  stat local_a0;
  
  std::error_code::clear(error);
  iVar1 = fstat(handle,&local_a0);
  if (iVar1 == -1) {
    eVar2 = last_error();
    error->_M_value = eVar2._M_value;
    error->_M_cat = eVar2._M_cat;
    local_a0.st_size = 0;
  }
  return local_a0.st_size;
}

Assistant:

inline size_t query_file_size(file_handle_type handle, std::error_code& error)
{
    error.clear();
#ifdef _WIN32
    LARGE_INTEGER file_size;
    if(::GetFileSizeEx(handle, &file_size) == 0)
    {
        error = detail::last_error();
        return 0;
    }
	return static_cast<int64_t>(file_size.QuadPart);
#else // POSIX
    struct stat sbuf;
    if(::fstat(handle, &sbuf) == -1)
    {
        error = detail::last_error();
        return 0;
    }
    return sbuf.st_size;
#endif
}